

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_fd.c
# Opt level: O2

int archive_write_open_fd(archive *a,int fd)

{
  int iVar1;
  int *client_data;
  
  client_data = (int *)malloc(4);
  if (client_data != (int *)0x0) {
    *client_data = fd;
    iVar1 = archive_write_open2(a,client_data,file_open,file_write,(undefined1 *)0x0,file_free);
    return iVar1;
  }
  archive_set_error(a,0xc,"No memory");
  return -0x1e;
}

Assistant:

int
archive_write_open_fd(struct archive *a, int fd)
{
	struct write_fd_data *mine;

	mine = malloc(sizeof(*mine));
	if (mine == NULL) {
		archive_set_error(a, ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	mine->fd = fd;
#if defined(__CYGWIN__) || defined(_WIN32)
	setmode(mine->fd, O_BINARY);
#endif
	return (archive_write_open2(a, mine,
		    file_open, file_write, NULL, file_free));
}